

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_color.h
# Opt level: O0

void * __thiscall
crnlib::pixel_packer::pack<crnlib::color_quad<unsigned_char,int>>
          (pixel_packer *this,color_quad<unsigned_char,_int> *color,void *p,bool rescale)

{
  uint uVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  int iVar4;
  byte in_CL;
  sbyte sVar5;
  long in_RDX;
  color_quad<unsigned_char,_int> *in_RSI;
  uint *in_RDI;
  uint bit_mask;
  uint byte_val;
  uint cur_byte_bits;
  uint cur_byte_bit_ofs;
  uint dst_bit_ofs;
  uint src_bit_ofs;
  uint32 h;
  uint32 n;
  uint32 mx;
  uint comp_size;
  uint i;
  uint8 *pDst;
  uint local_44;
  uint local_40;
  uint local_38;
  uint local_34;
  uint local_2c;
  
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    uVar1 = in_RDI[(ulong)local_2c + 2];
    if (uVar1 != 0) {
      local_34 = in_RDI[(ulong)local_2c + 10];
      if ((in_CL & 1) == 0) {
        bVar3 = color_quad<unsigned_char,_int>::operator[](in_RSI,local_2c);
        local_38 = math::minimum<unsigned_int>((uint)bVar3,local_34);
      }
      else {
        bVar3 = color_quad<unsigned_char,_int>::operator[](in_RSI,local_2c);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (ulong)bVar3 * (ulong)local_34 + 0x7f;
        local_38 = SUB164(auVar2 / ZEXT816(0xff),0);
      }
      local_40 = 0;
      local_44 = in_RDI[(ulong)local_2c + 6];
      for (; local_40 < uVar1; local_40 = iVar4 + local_40) {
        iVar4 = 8 - (local_44 & 7);
        sVar5 = (sbyte)(local_44 & 7);
        *(byte *)(in_RDX + (ulong)(local_44 >> 3)) =
             (byte)(local_38 << sVar5) |
             ((byte)(local_34 << sVar5) ^ 0xff) & *(byte *)(in_RDX + (ulong)(local_44 >> 3));
        local_34 = local_34 >> ((byte)iVar4 & 0x1f);
        local_38 = local_38 >> ((byte)iVar4 & 0x1f);
        local_44 = iVar4 + local_44;
      }
    }
  }
  return (void *)(in_RDX + (ulong)*in_RDI);
}

Assistant:

void* pack(const color_quad_type& color, void* p, bool rescale = true) const {
    uint8* pDst = static_cast<uint8*>(p);

    for (uint i = 0; i < 4; i++) {
      const uint comp_size = m_comp_size[i];
      if (!comp_size)
        continue;

      uint32 mx = m_comp_max[i];

      uint32 n;
      if (color_quad_type::component_traits::cFloat) {
        typename color_quad_type::parameter_t t = color[i];
        if (t < 0.0f)
          n = 0;
        else if (t > static_cast<typename color_quad_type::parameter_t>(mx))
          n = mx;
        else
          n = math::minimum<uint32>(static_cast<uint32>(floor(t + .5f)), mx);
      } else if (rescale) {
        if (color_quad_type::component_traits::cSigned)
          n = math::maximum<int>(static_cast<int>(color[i]), 0);
        else
          n = static_cast<uint32>(color[i]);

        const uint32 h = static_cast<uint32>(color_quad_type::component_traits::cMax);
        n = static_cast<uint32>((static_cast<uint64>(n) * mx + (h >> 1)) / h);
      } else {
        if (color_quad_type::component_traits::cSigned)
          n = math::minimum<uint32>(static_cast<uint32>(math::maximum<int>(static_cast<int>(color[i]), 0)), mx);
        else
          n = math::minimum<uint32>(static_cast<uint32>(color[i]), mx);
      }

      uint src_bit_ofs = 0;
      uint dst_bit_ofs = m_comp_ofs[i];
      while (src_bit_ofs < comp_size) {
        const uint cur_byte_bit_ofs = (dst_bit_ofs & 7);
        const uint cur_byte_bits = 8 - cur_byte_bit_ofs;

        uint byte_val = pDst[dst_bit_ofs >> 3];
        uint bit_mask = (mx << cur_byte_bit_ofs) & 0xFF;
        byte_val &= ~bit_mask;
        byte_val |= (n << cur_byte_bit_ofs);
        pDst[dst_bit_ofs >> 3] = static_cast<uint8>(byte_val);

        mx >>= cur_byte_bits;
        n >>= cur_byte_bits;

        dst_bit_ofs += cur_byte_bits;
        src_bit_ofs += cur_byte_bits;
      }
    }

    return pDst + m_pixel_stride;
  }